

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  _Bool _Var1;
  CURLcode CVar2;
  uchar *local_40;
  uchar *host_sep;
  uchar *iptr;
  _Bool left;
  _Bool query_local;
  size_t sStack_28;
  _Bool relative_local;
  size_t len_local;
  char *url_local;
  dynbuf *o_local;
  
  iptr._5_1_ = (query ^ 0xffU) & 1;
  host_sep = (uchar *)url;
  sStack_28 = len;
  local_40 = (uchar *)url;
  if (!relative) {
    local_40 = (uchar *)find_host_sep(url);
  }
  do {
    if (sStack_28 == 0) {
      return CURLUE_OK;
    }
    if (host_sep < local_40) {
      CVar2 = Curl_dyn_addn(o,host_sep,1);
      if (CVar2 != CURLE_OK) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
    else if (*host_sep == ' ') {
      if (iptr._5_1_ == 0) {
        CVar2 = Curl_dyn_addn(o,"+",1);
        if (CVar2 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      else {
        CVar2 = Curl_dyn_addn(o,"%20",3);
        if (CVar2 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
    }
    else {
      if (*host_sep == '?') {
        iptr._5_1_ = 0;
      }
      _Var1 = urlchar_needs_escaping((uint)*host_sep);
      if (_Var1) {
        CVar2 = Curl_dyn_addf(o,"%%%02x",(ulong)*host_sep);
        if (CVar2 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      else {
        CVar2 = Curl_dyn_addn(o,host_sep,1);
        if (CVar2 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
    }
    host_sep = host_sep + 1;
    sStack_28 = sStack_28 - 1;
  } while( true );
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(iptr = (unsigned char *)url;    /* read from here */
      len; iptr++, len--) {

    if(iptr < host_sep) {
      if(Curl_dyn_addn(o, iptr, 1))
        return CURLUE_OUT_OF_MEMORY;
      continue;
    }

    if(*iptr == ' ') {
      if(left) {
        if(Curl_dyn_addn(o, "%20", 3))
          return CURLUE_OUT_OF_MEMORY;
      }
      else {
        if(Curl_dyn_addn(o, "+", 1))
          return CURLUE_OUT_OF_MEMORY;
      }
      continue;
    }

    if(*iptr == '?')
      left = FALSE;

    if(urlchar_needs_escaping(*iptr)) {
      if(Curl_dyn_addf(o, "%%%02x", *iptr))
        return CURLUE_OUT_OF_MEMORY;
    }
    else {
      if(Curl_dyn_addn(o, iptr, 1))
        return CURLUE_OUT_OF_MEMORY;
    }
  }

  return CURLUE_OK;
}